

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledInputFile.cpp
# Opt level: O0

bool __thiscall Imf_2_5::TiledInputFile::isValidLevel(TiledInputFile *this,int lx,int ly)

{
  LevelMode LVar1;
  int iVar2;
  int in_EDX;
  int in_ESI;
  TiledInputFile *in_RDI;
  
  if ((((-1 < in_ESI) && (-1 < in_EDX)) &&
      ((LVar1 = levelMode(in_RDI), LVar1 != MIPMAP_LEVELS || (in_ESI == in_EDX)))) &&
     ((iVar2 = numXLevels(in_RDI), in_ESI < iVar2 && (iVar2 = numYLevels(in_RDI), in_EDX < iVar2))))
  {
    return true;
  }
  return false;
}

Assistant:

bool	
TiledInputFile::isValidLevel (int lx, int ly) const
{
    if (lx < 0 || ly < 0)
	return false;

    if (levelMode() == MIPMAP_LEVELS && lx != ly)
	return false;

    if (lx >= numXLevels() || ly >= numYLevels())
	return false;

    return true;
}